

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateEnumToPool(EnumDescriptor *en,Printer *printer)

{
  int iVar1;
  EnumValueDescriptor *this;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  EnumDescriptor *in_RDI;
  EnumValueDescriptor *value;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  Printer *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [5];
  char *in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  bool in_stack_ffffffffffffffb7;
  EnumDescriptor *in_stack_ffffffffffffffb8;
  int local_40;
  string *in_stack_ffffffffffffffc8;
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  EnumDescriptor *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  DescriptorFullName<google::protobuf::EnumDescriptor>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
  EnumDescriptor::name_abi_cxx11_(local_8);
  io::Printer::Print<char[5],std::__cxx11::string,char[11],std::__cxx11::string>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,&in_stack_ffffffffffffff80->variable_delimiter_,
             in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  Indent((Printer *)0x4a6d9a);
  local_40 = 0;
  while( true ) {
    iVar1 = EnumDescriptor::value_count(local_8);
    if (iVar1 <= local_40) break;
    this = EnumDescriptor::value(local_8,local_40);
    __rhs = local_10;
    EnumValueDescriptor::name_abi_cxx11_(this);
    ConstantNamePrefix(in_stack_ffffffffffffffc8);
    __lhs = EnumValueDescriptor::name_abi_cxx11_(this);
    std::operator+(__lhs,__rhs);
    EnumValueDescriptor::number(this);
    IntToString_abi_cxx11_(printer._4_4_);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,&in_stack_ffffffffffffff80->variable_delimiter_,
               in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    local_40 = local_40 + 1;
  }
  io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  Outdent((Printer *)0x4a6f61);
  return;
}

Assistant:

void GenerateEnumToPool(const EnumDescriptor* en, io::Printer* printer) {
  printer->Print(
      "$pool->addEnum('^name^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "name", DescriptorFullName(en, true),
      "class_name", en->name());
  Indent(printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
        "->value(\"^name^\", ^number^)\n",
        "name", ConstantNamePrefix(value->name()) + value->name(),
        "number", IntToString(value->number()));
  }
  printer->Print("->finalizeToPool();\n\n");
  Outdent(printer);
}